

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O0

void UpdateThumbVFPPredicate(cs_struct *ud,MCInst *MI)

{
  byte bVar1;
  MCOperandInfo *pMVar2;
  _Bool _Var3;
  uint uVar4;
  uint uVar5;
  MCOperand *pMVar6;
  uint local_2c;
  uint i;
  MCOperandInfo *OpInfo;
  unsigned_short NumOps;
  uint CC;
  MCInst *MI_local;
  cs_struct *ud_local;
  
  uVar4 = ITStatus_getITCC(&ud->ITBlock);
  _Var3 = ITStatus_instrInITBlock(&ud->ITBlock);
  if (_Var3) {
    ITStatus_advanceITState(&ud->ITBlock);
  }
  uVar5 = MCInst_getOpcode(MI);
  pMVar2 = ARMInsts[uVar5].OpInfo;
  uVar5 = MCInst_getOpcode(MI);
  bVar1 = ARMInsts[uVar5].NumOperands;
  local_2c = 0;
  while( true ) {
    if (bVar1 <= local_2c) {
      return;
    }
    _Var3 = MCOperandInfo_isPredicate(pMVar2 + local_2c);
    if (_Var3) break;
    local_2c = local_2c + 1;
  }
  pMVar6 = MCInst_getOperand(MI,local_2c);
  MCOperand_setImm(pMVar6,(ulong)uVar4);
  if (uVar4 == 0xe) {
    pMVar6 = MCInst_getOperand(MI,local_2c + 1);
    MCOperand_setReg(pMVar6,0);
    return;
  }
  pMVar6 = MCInst_getOperand(MI,local_2c + 1);
  MCOperand_setReg(pMVar6,3);
  return;
}

Assistant:

static void UpdateThumbVFPPredicate(cs_struct *ud, MCInst *MI)
{
	unsigned CC;
	unsigned short NumOps;
	MCOperandInfo *OpInfo;
	unsigned i;

	CC = ITStatus_getITCC(&(ud->ITBlock));
	if (ITStatus_instrInITBlock(&(ud->ITBlock)))
		ITStatus_advanceITState(&(ud->ITBlock));

	OpInfo = ARMInsts[MCInst_getOpcode(MI)].OpInfo;
	NumOps = ARMInsts[MCInst_getOpcode(MI)].NumOperands;

	for (i = 0; i < NumOps; ++i) {
		if (MCOperandInfo_isPredicate(&OpInfo[i])) {
			MCOperand_setImm(MCInst_getOperand(MI, i), CC);
			if (CC == ARMCC_AL)
				MCOperand_setReg(MCInst_getOperand(MI, i+1), 0);
			else
				MCOperand_setReg(MCInst_getOperand(MI, i+1), ARM_CPSR);
			return;
		}
	}
}